

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

bool __thiscall Jinx::Impl::Parser::Expect(Parser *this,SymbolType symbol,char *errMsg)

{
  bool bVar1;
  char *local_30;
  char *local_28;
  
  local_30 = errMsg;
  bVar1 = Accept(this,symbol);
  if (!bVar1) {
    if (errMsg == (char *)0x0) {
      local_28 = GetSymbolTypeText(symbol);
      Error<char_const*>(this,"Expected symbol %s",&local_28);
    }
    else {
      Error<char_const*&>(this,"%s",&local_30);
    }
  }
  return bVar1;
}

Assistant:

inline_t bool Parser::Expect(SymbolType symbol, const char * errMsg)
	{
		if (Accept(symbol))
			return true;
		if (errMsg)
			Error("%s", errMsg);
		else
			Error("Expected symbol %s", GetSymbolTypeText(symbol));
		return false;
	}